

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O2

drmp3_bool32 drmp3__on_seek(drmp3 *pMP3,int offset,drmp3_seek_origin origin)

{
  drmp3_bool32 dVar1;
  ulong uVar2;
  
  dVar1 = (*pMP3->onSeek)(pMP3->pUserData,offset,origin);
  if (dVar1 == 0) {
    dVar1 = 0;
  }
  else {
    uVar2 = (ulong)(uint)offset;
    if (origin != drmp3_seek_origin_start) {
      uVar2 = uVar2 + pMP3->streamCursor;
    }
    pMP3->streamCursor = uVar2;
    dVar1 = 1;
  }
  return dVar1;
}

Assistant:

static drmp3_bool32 drmp3__on_seek(drmp3* pMP3, int offset, drmp3_seek_origin origin)
{
    DRMP3_ASSERT(offset >= 0);

    if (!pMP3->onSeek(pMP3->pUserData, offset, origin)) {
        return DRMP3_FALSE;
    }

    if (origin == drmp3_seek_origin_start) {
        pMP3->streamCursor = (drmp3_uint64)offset;
    } else {
        pMP3->streamCursor += offset;
    }

    return DRMP3_TRUE;
}